

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_pw91.c
# Opt level: O0

void mpw91_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar2;
  double dVar3;
  double beta;
  double bt;
  gga_x_pw91_params *params;
  
  pdVar1 = (double *)in_RDI->params;
  dVar2 = get_ext_param(in_RDI,in_RSI,0);
  dVar3 = get_ext_param(in_RDI,in_RSI,1);
  pdVar1[5] = dVar3;
  dVar3 = get_ext_param(in_RDI,in_RSI,2);
  pdVar1[6] = dVar3;
  dVar3 = pow(113.09733552923255,-1.6666666666666667);
  *pdVar1 = (dVar2 * 6.0) / 0.1282782438530422;
  pdVar1[1] = 7.795554179441507;
  pdVar1[2] = dVar2 / 0.015312087450269405;
  pdVar1[3] = -(dVar2 - dVar3 * 5.0) / 0.015312087450269405;
  dVar2 = pow(0.1282782438530422,pdVar1[6]);
  pdVar1[4] = 1e-06 / (dVar2 * 0.9305257363491001);
  return;
}

Assistant:

static void
mpw91_set_ext_params(xc_func_type *p, const double *ext_params)
{
  gga_x_pw91_params *params;
  double bt, beta;

  assert(p != NULL && p->params != NULL);
  params = (gga_x_pw91_params *) (p->params);

  bt = get_ext_param(p, ext_params, 0);
  params->alpha = get_ext_param(p, ext_params, 1);
  params->expo  = get_ext_param(p, ext_params, 2);

  beta         =  5.0*pow(36.0*M_PI,-5.0/3.0);
  params->a    =  6.0*bt/X2S;
  params->b    =  1.0/X2S;
  params->c    =  bt/(X_FACTOR_C*X2S*X2S);
  params->d    = -(bt - beta)/(X_FACTOR_C*X2S*X2S);
  params->f    =  1.0e-6/(X_FACTOR_C*pow(X2S, params->expo));
}